

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

float32 commonNaNToFloat32(commonNaNT a,float_status *status)

{
  float32 fVar1;
  
  if ((status->default_nan_mode == '\0') && (a.high >> 0x29 != 0)) {
    return (a.high._4_4_ >> 9) + a._0_4_ * -0x80000000 + 0x7f800000;
  }
  fVar1 = float32_default_nan_tricore(status);
  return fVar1;
}

Assistant:

static float32 commonNaNToFloat32(commonNaNT a, float_status *status)
{
    uint32_t mantissa = a.high >> 41;

    if (status->default_nan_mode) {
        return float32_default_nan(status);
    }

    if (mantissa) {
        return make_float32(
            (((uint32_t)a.sign) << 31) | 0x7F800000 | (a.high >> 41));
    } else {
        return float32_default_nan(status);
    }
}